

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buttons.cpp
# Opt level: O2

void __thiscall
GPIO::PushButton::PushButton
          (PushButton *this,uint pin,GPIO_PULL pullupdown,nanoseconds min_trigger_interval,
          nanoseconds min_hold_interval)

{
  _Any_data __tmp;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type p_Stack_20;
  
  Switch::Switch(&this->super_Switch,pin,pullupdown,min_trigger_interval,min_hold_interval);
  (this->super_Switch).super_InputDetect.super_ObjectBase._vptr_ObjectBase =
       (_func_int **)&PTR__PushButton_00118940;
  *(undefined8 *)&(this->f_pushed).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->f_pushed).super__Function_base._M_functor + 8) = 0;
  (this->f_pushed).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->f_pushed)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->f_released).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->f_released).super__Function_base._M_functor + 8) = 0;
  (this->f_released).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->f_released)._M_invoker = (_Invoker_type)0x0;
  (this->last_pushed).__d.__r = 0;
  local_38._M_unused._0_8_ =
       (undefined8)*(undefined8 *)&(this->super_Switch).f_on.super__Function_base._M_functor;
  local_38._8_8_ =
       *(undefined8 *)((long)&(this->super_Switch).f_on.super__Function_base._M_functor + 8);
  *(PushButton **)&(this->super_Switch).f_on.super__Function_base._M_functor = this;
  *(undefined8 *)((long)&(this->super_Switch).f_on.super__Function_base._M_functor + 8) = 0;
  local_28 = (this->super_Switch).f_on.super__Function_base._M_manager;
  p_Stack_20 = (this->super_Switch).f_on._M_invoker;
  (this->super_Switch).f_on.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JoachimSchurig[P]CppGPIO/src/buttons.cpp:403:12)>
       ::_M_manager;
  (this->super_Switch).f_on._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JoachimSchurig[P]CppGPIO/src/buttons.cpp:403:12)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  local_38._M_unused._0_8_ =
       (undefined8)*(undefined8 *)&(this->super_Switch).f_off.super__Function_base._M_functor;
  local_38._8_8_ =
       *(undefined8 *)((long)&(this->super_Switch).f_off.super__Function_base._M_functor + 8);
  *(PushButton **)&(this->super_Switch).f_off.super__Function_base._M_functor = this;
  *(undefined8 *)((long)&(this->super_Switch).f_off.super__Function_base._M_functor + 8) = 0;
  local_28 = (this->super_Switch).f_off.super__Function_base._M_manager;
  p_Stack_20 = (this->super_Switch).f_off._M_invoker;
  (this->super_Switch).f_off.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JoachimSchurig[P]CppGPIO/src/buttons.cpp:410:13)>
       ::_M_manager;
  (this->super_Switch).f_off._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JoachimSchurig[P]CppGPIO/src/buttons.cpp:410:13)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return;
}

Assistant:

PushButton::PushButton(unsigned int pin,
                       GPIO_PULL pullupdown,
                       std::chrono::nanoseconds min_trigger_interval,
                       std::chrono::nanoseconds min_hold_interval)
: Switch(pin,
         pullupdown,
         min_trigger_interval,
         min_hold_interval)
{
    // set Switch::f_on with a lambda expression to forward the push event

    f_on = [&]() {
        last_pushed = std::chrono::steady_clock::now();
        if (f_pushed) f_pushed();
    };
    
    // set Switch::f_off with a lambda expression to forward the released event

    f_off = [&]() {
        auto now = std::chrono::steady_clock::now();
        if (f_released) f_released(now - last_pushed);
    };
}